

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_foreach_macro.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int max_iteration;
  ostream *poVar1;
  
  max_iteration = 0x400;
  if (1 < argc) {
    max_iteration = atoi(argv[1]);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"#ifndef ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_DETAIL_FOREACH_HPP");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"#define ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_DETAIL_FOREACH_HPP");
  std::operator<<(poVar1,"\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"// Generated by GenerateForeachMacro ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,max_iteration);
  std::operator<<(poVar1,"\n");
  write_count((ostream *)&std::cout,max_iteration + 1);
  write_foreach((ostream *)&std::cout,max_iteration);
  poVar1 = std::operator<<((ostream *)&std::cout,"\n#endif // ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_DETAIL_FOREACH_HPP");
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
  /** The max number of arguments FOREACH will call F */
  const int max_iteration = (argc >= 2) ? std::atoi(argv[1]) : 1024; // NOLINT

  std::cout << "#ifndef " << header_guard << "\n"
            << "#define " << header_guard << "\n\n";

  std::cout << "// Generated by GenerateForeachMacro " << max_iteration << "\n";

  write_count(std::cout, max_iteration+1);
  write_foreach(std::cout, max_iteration);

  std::cout << "\n#endif // " << header_guard << "\n";
}